

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall AActor::AdjustReflectionAngle(AActor *this,AActor *thing,DAngle *angle)

{
  uint uVar1;
  double dVar2;
  char cVar3;
  DAngle *max_pitch;
  DAngle *max_turn;
  AActor *pAVar5;
  DAngle *ang_offset;
  DAngle *pitch_offset;
  DAngle local_68;
  DAngle local_60;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  DAngle local_30;
  uint uVar4;
  
  if (((this->flags2).Value & 1) != 0) {
    return true;
  }
  uVar4 = (thing->flags7).Value;
  if ((uVar4 >> 0xb & 1) != 0) {
    return false;
  }
  uVar1 = (thing->flags4).Value;
  if ((uVar1 >> 0x19 & 1) == 0) {
    uVar4 = FRandom::GenRand32(&pr_reflect);
    cVar3 = (char)uVar4;
    if ((uVar1 >> 0x1a & 1) != 0) goto LAB_00422cdf;
    dVar2 = (double)(int)((uVar4 & 0xf) - 8) + angle->Degrees;
  }
  else {
    if ((uVar4 >> 0x1b & 1) != 0) {
      return true;
    }
    if (45.0 < ABS((double)SUB84((angle->Degrees - (thing->Angles).Yaw.Degrees) * 11930464.711111112
                                 + 6755399441055744.0,0) * 8.381903171539307e-08)) {
      return true;
    }
    uVar4 = FRandom::GenRand32(&pr_reflect);
    cVar3 = (char)uVar4;
LAB_00422cdf:
    if (cVar3 < '\0') {
      dVar2 = angle->Degrees + -45.0;
    }
    else {
      dVar2 = angle->Degrees + 45.0;
    }
  }
  angle->Degrees = dVar2;
  if (((thing->flags7).Value & 0x2000) != 0) {
    pAVar5 = (this->target).field_0.p;
    if (pAVar5 != (AActor *)0x0) {
      if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar5 = (this->target).field_0.p;
        if ((pAVar5 != (AActor *)0x0) &&
           (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->target).field_0.p = (AActor *)0x0;
          pAVar5 = (AActor *)0x0;
        }
        max_turn = &local_30;
        local_30.Degrees = 0.0;
        max_pitch = &local_38;
        local_38.Degrees = 270.0;
        ang_offset = &local_40;
        local_40.Degrees = 0.0;
        pitch_offset = &local_48;
        goto LAB_00422dd2;
      }
      (this->target).field_0.p = (AActor *)0x0;
    }
    pAVar5 = (thing->target).field_0.p;
    if (pAVar5 != (AActor *)0x0) {
      if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar5 = (thing->target).field_0.p;
        if ((pAVar5 != (AActor *)0x0) &&
           (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (thing->target).field_0.p = (AActor *)0x0;
          pAVar5 = (AActor *)0x0;
        }
        max_turn = &local_50;
        local_50.Degrees = 0.0;
        max_pitch = &local_58;
        local_58.Degrees = 270.0;
        ang_offset = &local_60;
        local_60.Degrees = 0.0;
        pitch_offset = &local_68;
LAB_00422dd2:
        pitch_offset->Degrees = 0.0;
        A_Face(this,pAVar5,max_turn,max_pitch,ang_offset,pitch_offset,0,0.0);
        return false;
      }
      (thing->target).field_0.p = (AActor *)0x0;
    }
  }
  return false;
}

Assistant:

bool AActor::AdjustReflectionAngle (AActor *thing, DAngle &angle)
{
	if (flags2 & MF2_DONTREFLECT) return true;
	if (thing->flags7 & MF7_THRUREFLECT) return false;
	// Change angle for reflection
	if (thing->flags4&MF4_SHIELDREFLECT)
	{
		// Shield reflection (from the Centaur)
		if (absangle(angle, thing->Angles.Yaw) > 45)
			return true;	// Let missile explode

		if (thing->flags7 & MF7_NOSHIELDREFLECT) return true;

		if (pr_reflect () < 128)
			angle += 45;
		else
			angle -= 45;

	}
	else if (thing->flags4&MF4_DEFLECT)
	{
		// deflect (like the Heresiarch)
		if(pr_reflect() < 128) 
			angle += 45;
		else 
			angle -= 45;
	}
	else
	{
		angle += ((pr_reflect() % 16) - 8);
	}
	//Always check for AIMREFLECT, no matter what else is checked above.
	if (thing->flags7 & MF7_AIMREFLECT)
	{
		if (this->target != NULL)
		{
			A_Face(this, this->target);
		}
		else if (thing->target != NULL)
		{
			A_Face(this, thing->target);
		}
	}
	
	return false;
}